

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_alphamapblit_quint16
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride,QClipData *clip,bool useGammaCorrection)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  bool bVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  QRgba64 *in_RCX;
  int in_EDX;
  int in_ESI;
  QRasterBuffer *in_RDI;
  QRasterBuffer *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  int in_stack_00000008;
  int in_stack_00000018;
  int in_stack_0000001c;
  byte in_stack_00000020;
  int xp;
  int end;
  int start;
  QT_FT_Span *clip_1;
  int i_1;
  quint16 *dest_1;
  ClipLine *line;
  int yp;
  int bottom;
  int top;
  int i;
  int destStride;
  quint16 *dest;
  quint16 c;
  int in_stack_00004030;
  int in_stack_00004038;
  QClipData *in_stack_00004040;
  undefined2 in_stack_ffffffffffffff40;
  quint16 in_stack_ffffffffffffff42;
  int in_stack_ffffffffffffff44;
  quint16 *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  int local_9c;
  int local_84;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 useGammaCorrection_00;
  int iVar8;
  int in_stack_ffffffffffffffa4;
  uchar *in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb2;
  int local_2c;
  int local_28;
  int local_24;
  int local_20 [3];
  int local_14;
  long local_10;
  
  useGammaCorrection_00 = (undefined1)((uint)in_stack_ffffffffffffffa0 >> 0x18);
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = in_stack_00000020 & 1;
  if ((bVar3 == 0) &&
     (local_20[2] = in_EDX, local_14 = in_ESI, bVar4 = QRgba64::isOpaque(in_RCX), bVar4)) {
    QRgba64::toRgb16((QRgba64 *)
                     CONCAT44(in_stack_ffffffffffffff44,
                              CONCAT22(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40)));
    if (CONCAT44(in_stack_0000001c,in_stack_00000018) == 0) {
      QRasterBuffer::scanLine(in_RDI,local_20[2]);
      QRasterBuffer::stride<unsigned_short>(in_RDI);
      while (in_stack_00000008 = in_stack_00000008 + -1, -1 < in_stack_00000008) {
        for (iVar8 = 0; iVar8 < in_R9D; iVar8 = iVar8 + 1) {
          alphamapblend_quint16
                    (in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                     in_stack_ffffffffffffff42);
        }
      }
    }
    else {
      local_20[1] = 0;
      piVar5 = qMax<int>(local_20 + 2,local_20 + 1);
      iVar8 = *piVar5;
      local_20[0] = local_20[2] + in_stack_00000008;
      local_24 = QRasterBuffer::height(in_RDI);
      piVar5 = qMin<int>(local_20,&local_24);
      iVar1 = *piVar5;
      QClipData::initialize
                ((QClipData *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      for (; iVar8 < iVar1; iVar8 = iVar8 + 1) {
        piVar5 = (int *)(*(long *)(CONCAT44(in_stack_0000001c,in_stack_00000018) + 8) +
                        (long)iVar8 * 0x10);
        QRasterBuffer::scanLine(in_RDI,iVar8);
        for (local_84 = 0; local_84 < *piVar5; local_84 = local_84 + 1) {
          piVar6 = (int *)(*(long *)(piVar5 + 2) + (long)local_84 * 0x10);
          piVar7 = qMax<int>(&local_14,piVar6);
          local_9c = *piVar7;
          local_28 = local_14 + in_R9D;
          local_2c = *piVar6 + piVar6[1];
          piVar6 = qMin<int>(&local_28,&local_2c);
          iVar2 = *piVar6;
          for (; local_9c < iVar2; local_9c = local_9c + 1) {
            alphamapblend_quint16
                      (in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44
                       ,in_stack_ffffffffffffff42);
          }
        }
      }
    }
  }
  else {
    qt_alphamapblit_generic
              (in_R8,in_stack_0000001c,in_stack_00000018,
               (QRgba64 *)
               CONCAT44(in_R9D,CONCAT13(bVar3,CONCAT12(in_stack_ffffffffffffffb2,
                                                       in_stack_ffffffffffffffb0))),
               in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_00004030,
               in_stack_00004038,in_stack_00004040,(bool)useGammaCorrection_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qt_alphamapblit_quint16(QRasterBuffer *rasterBuffer,
                             int x, int y, const QRgba64 &color,
                             const uchar *map,
                             int mapWidth, int mapHeight, int mapStride,
                             const QClipData *clip, bool useGammaCorrection)
{
    if (useGammaCorrection || !color.isOpaque()) {
        qt_alphamapblit_generic(rasterBuffer, x, y, color, map, mapWidth, mapHeight, mapStride, clip, useGammaCorrection);
        return;
    }

    const quint16 c = color.toRgb16();

    if (!clip) {
        quint16 *dest = reinterpret_cast<quint16*>(rasterBuffer->scanLine(y)) + x;
        const int destStride = rasterBuffer->stride<quint16>();
        while (--mapHeight >= 0) {
            for (int i = 0; i < mapWidth; ++i)
                alphamapblend_quint16(map[i], dest, i, c);
            dest += destStride;
            map += mapStride;
        }
    } else {
        int top = qMax(y, 0);
        int bottom = qMin(y + mapHeight, rasterBuffer->height());
        map += (top - y) * mapStride;

        const_cast<QClipData *>(clip)->initialize();
        for (int yp = top; yp<bottom; ++yp) {
            const QClipData::ClipLine &line = clip->m_clipLines[yp];

            quint16 *dest = reinterpret_cast<quint16*>(rasterBuffer->scanLine(yp));

            for (int i=0; i<line.count; ++i) {
                const QT_FT_Span &clip = line.spans[i];

                int start = qMax<int>(x, clip.x);
                int end = qMin<int>(x + mapWidth, clip.x + clip.len);

                for (int xp=start; xp<end; ++xp)
                    alphamapblend_quint16(map[xp - x], dest, xp, c);
            } // for (i -> line.count)
            map += mapStride;
        } // for (yp -> bottom)
    }
}